

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Memswap_VerifyWithSmallAndLargeSizes_Test::TestBody
          (Memswap_VerifyWithSmallAndLargeSizes_Test *this)

{
  Memswap_VerifyWithSmallAndLargeSizes_Test *this_local;
  
  TestMemswap<0>();
  TestMemswap<1>();
  TestMemswap<10>();
  TestMemswap<100>();
  TestMemswap<1000>();
  TestMemswap<10000>();
  TestMemswap<100000>();
  TestMemswap<1000000>();
  TestMemswap<8>();
  TestMemswap<56>();
  TestMemswap<136>();
  TestMemswap<216>();
  TestMemswap<64>();
  TestMemswap<128>();
  TestMemswap<192>();
  TestMemswap<256>();
  return;
}

Assistant:

TEST(Memswap, VerifyWithSmallAndLargeSizes) {
  // Arbitrary sizes
  TestMemswap<0>();
  TestMemswap<1>();
  TestMemswap<10>();
  TestMemswap<100>();
  TestMemswap<1000>();
  TestMemswap<10000>();
  TestMemswap<100000>();
  TestMemswap<1000000>();

  // Pointer aligned sizes
  TestMemswap<sizeof(void*) * 1>();
  TestMemswap<sizeof(void*) * 7>();
  TestMemswap<sizeof(void*) * 17>();
  TestMemswap<sizeof(void*) * 27>();

  // Test also just the block size and no leftover.
  TestMemswap<64 * 1>();
  TestMemswap<64 * 2>();
  TestMemswap<64 * 3>();
  TestMemswap<64 * 4>();
}